

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopsops.c
# Opt level: O1

LispPTR LCFetchMethodOrHelp(LispPTR object,LispPTR selector)

{
  undefined4 *puVar1;
  ulong uVar2;
  bool bVar3;
  DLword *pDVar4;
  DLword *pDVar5;
  long lVar6;
  LispPTR LVar7;
  LispPTR datum;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  LispPTR local_50;
  
  uVar2 = (ulong)object;
  if (atom_instance == 0) {
    LCinit();
  }
  uVar8 = *(ushort *)((ulong)(object >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff;
  uVar8 = *(uint *)((long)DTDspace + (ulong)uVar8 * 4 + (ulong)(uVar8 << 5)) & 0xfffffff;
  if ((uVar8 == atom_instance) || (uVar8 == atom_class)) {
    if ((object & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar2);
    }
    pDVar4 = Lisp_world;
    uVar8 = *(uint *)(Lisp_world + uVar2);
    uVar12 = (ulong)uVar8;
    uVar10 = (ulong)(((uVar8 ^ selector) & 0x3ff) << 4);
    puVar1 = (undefined4 *)((long)&LCMethodCache->class + uVar10);
    if ((*(uint *)((long)&LCMethodCache->class + uVar10) == uVar8) && (puVar1[1] == selector)) {
      return puVar1[2];
    }
    if ((uVar8 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar12);
    }
    datum = *(LispPTR *)(Lisp_world + uVar12 + 0x10);
    local_50 = 0xfffffffe;
    do {
      if ((uVar12 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar12);
      }
      pDVar5 = Lisp_world;
      uVar10 = (ulong)*(uint *)(Lisp_world + uVar12 + 0x16);
      if (uVar10 == 0) {
LAB_0012d31b:
        LVar7 = car(datum);
        if (LVar7 == 0) {
          bVar3 = false;
          iVar9 = 4;
          uVar12 = 0;
        }
        else {
          uVar12 = (ulong)LVar7;
          datum = cdr(datum);
          iVar9 = 0;
          bVar3 = true;
        }
      }
      else {
        if ((*(uint *)(Lisp_world + uVar12 + 0x16) & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar10);
        }
        lVar6 = 0;
        do {
          lVar11 = lVar6;
          LVar7 = *(LispPTR *)((long)Lisp_world + lVar11 + uVar10 * 2);
          if (LVar7 == 0) goto LAB_0012d31b;
          lVar6 = lVar11 + 4;
        } while (LVar7 != selector);
        *puVar1 = *(undefined4 *)(pDVar4 + uVar2);
        puVar1[1] = selector;
        uVar8 = *(uint *)(pDVar5 + uVar12 + 0x18);
        if ((uVar8 & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar8);
        }
        local_50 = *(LispPTR *)((long)Lisp_world + lVar11 + (ulong)uVar8 * 2);
        puVar1[2] = local_50;
        iVar9 = 1;
        bVar3 = false;
      }
    } while (iVar9 == 0);
    if ((iVar9 != 4) && (!bVar3)) {
      return local_50;
    }
  }
  lcfuncall(atom_FetchMethodOrHelp_LCUFN,2,3);
  return 0xfffffffe;
}

Assistant:

LispPTR LCFetchMethodOrHelp(LispPTR object, LispPTR selector) {
  struct LCInstance *objptr;
  struct LCMethodCacheEntry *ce;
  LispPTR cur_class;

  LC_INIT;

  INSTANCE_CLASS_OR_PUNT(object, atom_FetchMethodOrHelp_LCUFN, 2);

  objptr = (struct LCInstance *)NativeAligned4FromLAddr(object);
  ce = &(LCMethodCache[METH_CACHE_INDEX((cur_class = objptr->class), selector)]);
  if (ce->class == cur_class && ce->selector == selector) return ce->method_fn;

  /* not in cache, search class then supers */
  {
    LispPTR supers = ((struct LCClass *)NativeAligned4FromLAddr(cur_class))->supers;

    for (;;) {
      int i = 0;
      LispPTR val;
      LispPTR *selectorptr;
      struct LCClass *classptr;

      classptr = (struct LCClass *)NativeAligned4FromLAddr(cur_class);
      if (classptr->selectors == NIL_PTR) {
        goto next_class;
      } else {
        selectorptr = (LispPTR *)NativeAligned4FromLAddr(classptr->selectors);
      }

      while ((val = selectorptr[i++]) != NIL_PTR) {
        if (val == selector) {
          ce->class = objptr->class;
          ce->selector = selector;
          return (ce->method_fn = ((LispPTR *)NativeAligned4FromLAddr(classptr->methods))[i - 1]);
        }
      }

    next_class:
      if ((cur_class = car(supers)) == NIL_PTR) break;
      supers = cdr(supers);
    }
  }

  /* we didn't find it at all; punt */
  RETCALL(atom_FetchMethodOrHelp_LCUFN, 2);

  /*  return lcfuncall(atom_FetchMethodOrHelp_LCUFN,2,3); */
  /*  return PUNT;*/
}